

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue178_test.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::Key2_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int i)

{
  string local_38;
  undefined4 local_14;
  string *psStack_10;
  int i_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  Key1_abi_cxx11_(&local_38,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),i);
  std::operator+(__return_storage_ptr__,&local_38,"_xxx");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Key2(int i) { return Key1(i) + "_xxx"; }